

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

int envy_bios_parse_power_sense(envy_bios *bios)

{
  byte bVar1;
  uint uVar2;
  uint8_t uVar3;
  byte bVar4;
  envy_bios_power_sense_entry *peVar5;
  ulong uVar6;
  uint8_t *puVar7;
  int iVar8;
  uint32_t uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  
  uVar12 = (bios->power).sense.offset;
  iVar14 = -0x16;
  if ((ulong)uVar12 != 0) {
    if (uVar12 < bios->length) {
      uVar3 = bios->data[uVar12];
      (bios->power).sense.version = uVar3;
    }
    else {
      (bios->power).sense.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar3 = (bios->power).sense.version;
    }
    if ((uVar3 == ' ') || (uVar3 == '\x10')) {
      uVar9 = (bios->power).sense.offset;
      uVar12 = uVar9 + 1;
      uVar2 = bios->length;
      if (uVar12 < uVar2) {
        (bios->power).sense.hlen = bios->data[uVar12];
        iVar14 = 0;
      }
      else {
        (bios->power).sense.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
        uVar9 = (bios->power).sense.offset;
        uVar2 = bios->length;
        iVar14 = -0xe;
      }
      uVar12 = uVar9 + 2;
      if (uVar12 < uVar2) {
        (bios->power).sense.rlen = bios->data[uVar12];
        iVar11 = 0;
      }
      else {
        (bios->power).sense.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
        uVar9 = (bios->power).sense.offset;
        uVar2 = bios->length;
        iVar11 = -0xe;
      }
      if (uVar9 + 3 < uVar2) {
        bVar4 = bios->data[uVar9 + 3];
        (bios->power).sense.entriesnum = bVar4;
        iVar8 = 0;
      }
      else {
        (bios->power).sense.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        bVar4 = (bios->power).sense.entriesnum;
        iVar8 = -0xe;
      }
      (bios->power).sense.valid = (iVar11 == 0 && iVar14 == 0) && iVar8 == 0;
      peVar5 = (envy_bios_power_sense_entry *)malloc((ulong)((uint)bVar4 * 8) * 3);
      (bios->power).sense.entries = peVar5;
      if (bVar4 != 0) {
        uVar6 = (ulong)(bios->power).sense.rlen;
        lVar13 = 6;
        iVar14 = 0;
        uVar15 = 0;
        do {
          uVar9 = (bios->power).sense.offset;
          bVar4 = (bios->power).sense.hlen;
          iVar11 = (int)uVar6;
          uVar12 = (int)uVar15 * iVar11 + uVar9 + (uint)bVar4;
          peVar5 = (bios->power).sense.entries;
          peVar5[uVar15].offset = uVar12;
          uVar3 = (bios->power).sense.version;
          if (uVar3 == ' ') {
            if (uVar12 < bios->length) {
              peVar5[uVar15].mode = bios->data[uVar12];
            }
            else {
              peVar5[uVar15].mode = '\0';
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
            }
            uVar12 = uVar12 + 1;
            puVar7 = &(bios->power).sense.entries[uVar15].extdev_id;
            if (uVar12 < bios->length) {
              *puVar7 = bios->data[uVar12];
            }
            else {
              *puVar7 = '\0';
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
            }
            bVar1 = (bios->power).sense.rlen;
            if (0x15 < bVar1) {
              fwrite("SENSE table entry bigger than expected\n",0x27,1,_stderr);
              bVar1 = (bios->power).sense.rlen;
            }
            uVar6 = (ulong)bVar1;
            if (5 < bVar1) {
              uVar10 = 0;
              do {
                uVar6 = ((uint)bVar4 + uVar9 + iVar11 * iVar14 + 5) + uVar10;
                peVar5 = (bios->power).sense.entries;
                if ((uint)uVar6 < bios->length) {
                  *(uint8_t *)((long)&peVar5->offset + uVar10 + lVar13) =
                       bios->data[uVar6 & 0xffffffff];
                }
                else {
                  *(undefined1 *)((long)&peVar5->offset + uVar10 + lVar13) = 0;
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                }
                uVar6 = (ulong)(bios->power).sense.rlen;
              } while ((uVar10 < 0xf) && (uVar10 = uVar10 + 1, (long)uVar10 < (long)(uVar6 - 5)));
            }
          }
          else if (uVar3 == '\x10') {
            if (uVar12 + 1 < bios->length) {
              peVar5[uVar15].mode = bios->data[uVar12 + 1];
            }
            else {
              peVar5[uVar15].mode = '\0';
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            }
            uVar12 = uVar12 + 2;
            puVar7 = &(bios->power).sense.entries[uVar15].extdev_id;
            if (uVar12 < bios->length) {
              *puVar7 = bios->data[uVar12];
            }
            else {
              *puVar7 = '\0';
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar12);
            }
            bVar1 = (bios->power).sense.rlen;
            if (0x13 < bVar1) {
              fwrite("SENSE table entry bigger than expected\n",0x27,1,_stderr);
              bVar1 = (bios->power).sense.rlen;
            }
            uVar6 = (ulong)bVar1;
            if (3 < bVar1) {
              uVar10 = 0;
              do {
                uVar6 = ((uint)bVar4 + uVar9 + iVar11 * iVar14 + 3) + uVar10;
                peVar5 = (bios->power).sense.entries;
                if ((uint)uVar6 < bios->length) {
                  *(uint8_t *)((long)&peVar5->offset + uVar10 + lVar13) =
                       bios->data[uVar6 & 0xffffffff];
                }
                else {
                  *(undefined1 *)((long)&peVar5->offset + uVar10 + lVar13) = 0;
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                }
                uVar6 = (ulong)(bios->power).sense.rlen;
              } while ((uVar10 < 0xf) && (uVar10 = uVar10 + 1, (long)uVar10 < (long)(uVar6 - 3)));
            }
          }
          uVar15 = uVar15 + 1;
          iVar14 = iVar14 + 1;
          lVar13 = lVar13 + 0x18;
        } while (uVar15 < (bios->power).sense.entriesnum);
      }
      iVar14 = 0;
    }
    else {
      envy_bios_parse_power_sense_cold_1();
    }
  }
  return iVar14;
}

Assistant:

int envy_bios_parse_power_sense(struct envy_bios *bios) {
	struct envy_bios_power_sense *sense = &bios->power.sense;
	int i, err = 0;

	if (!sense->offset)
		return -EINVAL;

	bios_u8(bios, sense->offset + 0x0, &sense->version);
	switch(sense->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, sense->offset + 0x1, &sense->hlen);
		err |= bios_u8(bios, sense->offset + 0x2, &sense->rlen);
		err |= bios_u8(bios, sense->offset + 0x3, &sense->entriesnum);
		sense->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown SENSE table version 0x%x\n", sense->version);
		return -EINVAL;
	};

	err = 0;
	sense->entries = malloc(sense->entriesnum * sizeof(struct envy_bios_power_sense_entry));
	for (i = 0; i < sense->entriesnum; i++) {
		uint32_t data = sense->offset + sense->hlen + i * sense->rlen;

		sense->entries[i].offset = data;

		switch(sense->version) {
		case 0x10:
			err |= bios_u8(bios, data + 0x1, &sense->entries[i].mode);
			err |= bios_u8(bios, data + 0x2, &sense->entries[i].extdev_id);
			if (sense->rlen - 0x3 > 0x10)
				ENVY_BIOS_ERR("SENSE table entry bigger than expected\n");
			for (int j = 0; j < sense->rlen - 0x3 && j < 0x10; ++j)
				err |= bios_u8(bios, data + 0x3 + j, &sense->entries[i].d.raw[j]);
			break;
		case 0x20:
			err |= bios_u8(bios, data + 0x0, &sense->entries[i].mode);
			err |= bios_u8(bios, data + 0x1, &sense->entries[i].extdev_id);
			if (sense->rlen - 0x5 > 0x10)
				ENVY_BIOS_ERR("SENSE table entry bigger than expected\n");
			for (int j = 0; j < sense->rlen - 0x5 && j < 0x10; ++j)
				err |= bios_u8(bios, data + 0x5 + j, &sense->entries[i].d.raw[j]);
			break;
		};
	}

	return 0;
}